

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

cbtHullTriangle * __thiscall HullLibrary::extrudable(HullLibrary *this,cbtScalar epsilon)

{
  long lVar1;
  cbtHullTriangle *pcVar2;
  cbtHullTriangle *pcVar3;
  ulong uVar4;
  
  uVar4 = 0;
  pcVar3 = (cbtHullTriangle *)0x0;
  do {
    if ((pcVar3 == (cbtHullTriangle *)0x0) ||
       ((lVar1 = *(long *)(*(long *)(this + 0x10) + uVar4 * 8), lVar1 != 0 &&
        (pcVar3->rise < *(float *)(lVar1 + 0x20))))) {
      pcVar3 = *(cbtHullTriangle **)(*(long *)(this + 0x10) + uVar4 * 8);
    }
    uVar4 = uVar4 + 1;
  } while (*(uint *)(this + 4) != uVar4);
  pcVar2 = (cbtHullTriangle *)0x0;
  if (epsilon < pcVar3->rise) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

cbtHullTriangle *HullLibrary::extrudable(cbtScalar epsilon)
{
	int i;
	cbtHullTriangle *t = NULL;
	for (i = 0; i < m_tris.size(); i++)
	{
		if (!t || (m_tris[i] && t->rise < m_tris[i]->rise))
		{
			t = m_tris[i];
		}
	}
	return (t->rise > epsilon) ? t : NULL;
}